

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Perfect.hpp
# Opt level: O3

Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
 __thiscall
Lib::
perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>>,Lib::PerfectIdComparison>
          (Lib *this,MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *t)

{
  ulong uVar1;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *extraout_RDX;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *extraout_RDX_00;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar2;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  PVar3;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> local_28;
  
  local_28._factors._capacity = (t->_factors)._capacity;
  (t->_factors)._capacity = 0;
  local_28._factors._end = (t->_factors)._end;
  local_28._factors._stack = (t->_factors)._stack;
  local_28._factors._cursor = (t->_factors)._cursor;
  (t->_factors)._cursor = (MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  (t->_factors)._end = (MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  (t->_factors)._stack = (MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  ::Perfect((Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
             *)this,&local_28);
  pMVar2 = extraout_RDX;
  if (local_28._factors._stack !=
      (MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0) {
    uVar1 = local_28._factors._capacity * 0x1c + 0xf & 0xfffffffffffffff0;
    if (uVar1 == 0) {
      *(undefined8 *)
       &((local_28._factors._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_28._factors._stack;
    }
    else if (uVar1 < 0x11) {
      *(undefined8 *)
       &((local_28._factors._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_28._factors._stack;
    }
    else if (uVar1 < 0x19) {
      *(undefined8 *)
       &((local_28._factors._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_28._factors._stack;
    }
    else if (uVar1 < 0x21) {
      *(undefined8 *)
       &((local_28._factors._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_28._factors._stack;
    }
    else if (uVar1 < 0x31) {
      *(undefined8 *)
       &((local_28._factors._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_28._factors._stack;
    }
    else if (uVar1 < 0x41) {
      *(undefined8 *)
       &((local_28._factors._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_28._factors._stack;
    }
    else {
      operator_delete(local_28._factors._stack,0x10);
      pMVar2 = extraout_RDX_00;
    }
  }
  PVar3._ptr = pMVar2;
  PVar3._0_8_ = this;
  return PVar3;
}

Assistant:

Perfect<T, Cmp> perfect(T t) 
{ return Perfect<T, Cmp>(std::move(t)); }